

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O1

bool __thiscall QNetworkCookieJar::insertCookie(QNetworkCookieJar *this,QNetworkCookie *cookie)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QList<QNetworkCookie> *this_00;
  long in_FS_OFFSET;
  QDateTime now;
  QNetworkCookie QStack_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  bVar2 = QNetworkCookie::isSessionCookie(cookie);
  if (bVar2) {
    bVar3 = 0;
  }
  else {
    QNetworkCookie::expirationDate(&QStack_48);
    bVar3 = compareThreeWay((QDateTime *)&QStack_48,(QDateTime *)&local_40);
    bVar3 = bVar3 >> 7;
    QDateTime::~QDateTime((QDateTime *)&QStack_48);
  }
  (**(code **)(*(long *)this + 0x80))(this,cookie);
  if (bVar3 == 0) {
    this_00 = (QList<QNetworkCookie> *)(lVar1 + 0x78);
    QtPrivate::QMovableArrayOps<QNetworkCookie>::emplace<QNetworkCookie_const&>
              ((QMovableArrayOps<QNetworkCookie> *)this_00,*(qsizetype *)(lVar1 + 0x88),cookie);
    QList<QNetworkCookie>::end(this_00);
  }
  QDateTime::~QDateTime((QDateTime *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool QNetworkCookieJar::insertCookie(const QNetworkCookie &cookie)
{
    Q_D(QNetworkCookieJar);
    const QDateTime now = QDateTime::currentDateTimeUtc();
    bool isDeletion = !cookie.isSessionCookie() &&
                      cookie.expirationDate() < now;

    deleteCookie(cookie);

    if (!isDeletion) {
        d->allCookies += cookie;
        return true;
    }
    return false;
}